

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  PromiseNode *pPVar1;
  Task *pTVar2;
  String *pSVar3;
  RemoveConst<kj::String> *pRVar4;
  String *pSVar5;
  String *pSVar6;
  TraceBuilder *in_RCX;
  Task *pTVar7;
  size_t newSize;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> *pMVar8;
  Vector<kj::String> traces;
  void *space [32];
  Vector<kj::String> local_198;
  String *local_170;
  String local_168;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 local_138 [256];
  undefined1 local_38 [8];
  
  local_198.builder.ptr = (String *)0x0;
  local_198.builder.pos = (String *)0x0;
  local_198.builder.endPtr = (String *)0x0;
  local_198.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pTVar7 = (this->tasks).ptr.ptr;
  local_170 = __return_storage_ptr__;
  if (pTVar7 != (Task *)0x0) {
    pMVar8 = &this->tasks;
    do {
      memset(local_138,0,0x100);
      local_140 = local_38;
      pPVar1 = (pTVar7->node).ptr;
      local_150 = local_138;
      local_148 = local_138;
      (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
                (pPVar1,(char (*) [7])&local_150,0);
      str<char_const(&)[7],kj::_::TraceBuilder&>
                (&local_168,(kj *)"task: ",(char (*) [7])&local_150,in_RCX);
      if (local_198.builder.pos == local_198.builder.endPtr) {
        newSize = ((long)local_198.builder.pos - (long)local_198.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_198.builder.pos == local_198.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::String>::setCapacity(&local_198,newSize);
      }
      ((local_198.builder.pos)->content).ptr = local_168.content.ptr;
      ((local_198.builder.pos)->content).size_ = local_168.content.size_;
      ((local_198.builder.pos)->content).disposer = local_168.content.disposer;
      local_198.builder.pos = local_198.builder.pos + 1;
      pTVar2 = (pMVar8->ptr).ptr;
      pTVar7 = (pTVar2->next).ptr.ptr;
      pMVar8 = &pTVar2->next;
      in_RCX = (TraceBuilder *)local_168.content.disposer;
    } while (pTVar7 != (Task *)0x0);
  }
  pSVar6 = local_170;
  strArray<kj::Vector<kj::String>&>
            (local_170,(kj *)&local_198,(Vector<kj::String> *)0x4f08e7,(char *)in_RCX);
  pSVar5 = local_198.builder.endPtr;
  pRVar4 = local_198.builder.pos;
  pSVar3 = local_198.builder.ptr;
  if (local_198.builder.ptr != (String *)0x0) {
    local_198.builder.ptr = (String *)0x0;
    local_198.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_198.builder.endPtr = (String *)0x0;
    (**(local_198.builder.disposer)->_vptr_ArrayDisposer)
              (local_198.builder.disposer,pSVar3,0x18,
               ((long)pRVar4 - (long)pSVar3 >> 3) * -0x5555555555555555,
               ((long)pSVar5 - (long)pSVar3 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return pSVar6;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<OwnTask>* ptr = &tasks;
  for (;;) {
    KJ_IF_SOME(task, *ptr) {
      traces.add(task->trace());
      ptr = &task->next;
    } else {
      break;
    }
  }